

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

char * FBehavior::StaticLookupString(DWORD index)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = index >> 0x14;
  if (uVar1 == 0x7ff) {
    pcVar2 = ACSStringPool::GetString(&GlobalACSStrings,index);
    return pcVar2;
  }
  if (uVar1 < StaticModules.Count) {
    pcVar2 = LookupString(StaticModules.Array[uVar1],index & 0xffff);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *FBehavior::StaticLookupString (DWORD index)
{
	DWORD lib = index >> LIBRARYID_SHIFT;

	if (lib == STRPOOL_LIBRARYID)
	{
		return GlobalACSStrings.GetString(index);
	}
	if (lib >= (DWORD)StaticModules.Size())
	{
		return NULL;
	}
	return StaticModules[lib]->LookupString (index & 0xffff);
}